

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<QString,_QVariant>::insert
          (QMap<QString,_QVariant> *this,const_iterator pos,QString *key,QVariant *value)

{
  long lVar1;
  bool bVar2;
  _Rb_tree_const_iterator<std::pair<const_QString,_QVariant>_> in_RSI;
  _Rb_tree_const_iterator<std::pair<const_QString,_QVariant>_> in_RDI;
  long in_FS_OFFSET;
  difference_type posDistance;
  QMap<QString,_QVariant> copy;
  const_iterator dpos;
  iterator in_stack_ffffffffffffff68;
  _Rb_tree_const_iterator<std::pair<const_QString,_QVariant>_> in_stack_ffffffffffffff70;
  _Rb_tree_const_iterator<std::pair<const_QString,_QVariant>_> in_stack_ffffffffffffff88;
  const_iterator in_stack_ffffffffffffff90;
  undefined8 local_28;
  iterator local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::_Rb_tree_const_iterator<std::pair<const_QString,_QVariant>_>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_QString,_QVariant>_> *)
             &stack0xffffffffffffffe0);
  local_28 = 0xaaaaaaaaaaaaaaaa;
  bVar2 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          ::isShared((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                      *)in_stack_ffffffffffffff70._M_node);
  if (bVar2) {
    QMap((QMap<QString,_QVariant> *)in_stack_ffffffffffffff70._M_node,
         (QMap<QString,_QVariant> *)in_stack_ffffffffffffff68._M_node);
  }
  else {
    memset(&local_28,0,8);
    QMap((QMap<QString,_QVariant> *)0x10ac2b);
  }
  bVar2 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                      *)0x10ac35);
  if ((!bVar2) ||
     (bVar2 = QtPrivate::
              QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              ::isShared((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                          *)in_stack_ffffffffffffff70._M_node), bVar2)) {
    bVar2 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                      ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                        *)0x10ac58);
    if (bVar2) {
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                    *)0x10ac68);
      std::
      map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
      ::cbegin((map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
                *)in_stack_ffffffffffffff68._M_node);
      std::distance<std::_Rb_tree_const_iterator<std::pair<QString_const,QVariant>>>
                (in_stack_ffffffffffffff88,in_RDI);
    }
    detach((QMap<QString,_QVariant> *)in_stack_ffffffffffffff70._M_node);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                  *)0x10acc3);
    in_stack_ffffffffffffff90 =
         std::
         map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
         ::cbegin(in_stack_ffffffffffffff68._M_node);
    in_RSI = std::next<std::_Rb_tree_const_iterator<std::pair<QString_const,QVariant>>>
                       (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68._M_node);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                *)0x10ad0b);
  std::map<QString,QVariant,std::less<QString>,std::allocator<std::pair<QString_const,QVariant>>>::
  insert_or_assign<QVariant_const&>
            ((map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
              *)in_stack_ffffffffffffff90._M_node,(const_iterator)in_RSI._M_node,
             (key_type *)in_stack_ffffffffffffff88._M_node,(QVariant *)in_RDI._M_node);
  iterator::iterator((iterator *)0x10ad47,in_stack_ffffffffffffff68);
  ~QMap((QMap<QString,_QVariant> *)0x10ad51);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (iterator)(iterator)local_10._M_node;
}

Assistant:

iterator insert(const_iterator pos, const Key &key, const T &value)
    {
        // TODO: improve. In case of assignment, why copying first?
        typename Map::const_iterator dpos;
        const auto copy = d.isShared() ? *this : QMap(); // keep `key`/`value` alive across the detach
        if (!d || d.isShared()) {
            auto posDistance = d ? std::distance(d->m.cbegin(), pos.i) : 0;
            detach();
            dpos = std::next(d->m.cbegin(), posDistance);
        } else {
            dpos = pos.i;
        }
        return iterator(d->m.insert_or_assign(dpos, key, value));
    }